

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O3

void Acec_ManPrintRanks(Vec_Int_t *vPairs)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  void *local_40;
  
  lVar9 = 1;
  local_40 = calloc(1,400);
  if (1 < vPairs->nSize) {
    uVar5 = 0;
    iVar3 = 100;
    uVar7 = 100;
    do {
      uVar2 = vPairs->pArray[lVar9];
      if ((int)uVar2 < (int)uVar7) {
        uVar8 = (ulong)uVar7;
      }
      else {
        uVar8 = (long)(int)uVar2 + 1;
        iVar6 = iVar3 * 2;
        if ((int)uVar2 < iVar6) {
          if (iVar3 <= (int)uVar2) {
            if (local_40 == (void *)0x0) {
              local_40 = malloc((long)iVar6 << 2);
            }
            else {
              local_40 = realloc(local_40,(long)iVar6 << 2);
            }
LAB_006712eb:
            iVar3 = iVar6;
            if (local_40 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
        }
        else if (iVar3 <= (int)uVar2) {
          if (local_40 == (void *)0x0) {
            local_40 = malloc(uVar8 * 4);
          }
          else {
            local_40 = realloc(local_40,uVar8 * 4);
          }
          iVar6 = (int)uVar8;
          goto LAB_006712eb;
        }
        memset((void *)((long)local_40 + (long)(int)uVar7 * 4),0,(ulong)(uVar2 - uVar7) * 4 + 4);
      }
      if (((int)uVar2 < 0) || (uVar7 = (uint)uVar8, (int)uVar7 <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)local_40 + (ulong)uVar2 * 4);
      *piVar1 = *piVar1 + 1;
      if ((int)uVar5 <= (int)uVar2) {
        uVar5 = uVar2;
      }
      lVar9 = lVar9 + 2;
    } while ((int)lVar9 < vPairs->nSize);
    if (uVar5 == 0) {
      putchar(10);
      goto LAB_006713ce;
    }
    uVar4 = 1;
    if (1 < (int)uVar7) {
      uVar4 = uVar8 & 0xffffffff;
    }
    uVar8 = 1;
    do {
      if (uVar4 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%2d=%2d ",uVar8 & 0xffffffff,(ulong)*(uint *)((long)local_40 + uVar8 * 4));
      uVar8 = uVar8 + 1;
    } while (uVar5 + 1 != uVar8);
  }
  putchar(10);
  if (local_40 == (void *)0x0) {
    return;
  }
LAB_006713ce:
  free(local_40);
  return;
}

Assistant:

void Acec_ManPrintRanks( Vec_Int_t * vPairs )
{
    int k, iObj, Count, Rank, RankMax = 0;
    Vec_Int_t * vCounts = Vec_IntStart( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, Rank, k )
    {
        Vec_IntFillExtra( vCounts, Rank+1, 0 );
        Vec_IntAddToEntry( vCounts, Rank, 1 );
        RankMax = Abc_MaxInt( RankMax, Rank );
    }
    Vec_IntForEachEntryStartStop( vCounts, Count, Rank, 1, RankMax+1 )
        printf( "%2d=%2d ", Rank, Count );
    printf( "\n" );
    Vec_IntFree( vCounts );
}